

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

int mapOceanMixMod(Layer *l,int *out,int x,int z,int w,int h)

{
  int id;
  int iVar1;
  void *__dest;
  long lVar2;
  size_t __size;
  long lVar3;
  long lVar4;
  void *pvVar5;
  
  (*l->p2->getMap)(l->p2,out,x,z,w,h);
  __size = (long)(h * w) << 2;
  __dest = malloc(__size);
  memcpy(__dest,out,__size);
  (*l->p->getMap)(l->p,out,x,z,w,h);
  if (0 < h) {
    lVar3 = (long)w;
    lVar2 = 0;
    pvVar5 = __dest;
    do {
      if (0 < w) {
        lVar4 = 0;
        do {
          id = out[lVar4];
          iVar1 = isOceanic(id);
          if (iVar1 != 0) {
            iVar1 = *(int *)((long)pvVar5 + lVar4 * 4);
            if (id == 0x18) {
              if (iVar1 < 0x2d) {
                if (iVar1 == 0) {
                  iVar1 = 0x18;
                }
                else if (iVar1 == 10) {
                  iVar1 = 0x32;
                }
              }
              else if (iVar1 == 0x2e) {
                iVar1 = 0x31;
              }
              else if (iVar1 == 0x2d) {
                iVar1 = 0x30;
              }
            }
            out[lVar4] = iVar1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      lVar2 = lVar2 + 1;
      pvVar5 = (void *)((long)pvVar5 + lVar3 * 4);
      out = out + lVar3;
    } while (lVar2 != h);
  }
  free(__dest);
  return 0;
}

Assistant:

int mapOceanMixMod(const Layer * l, int * out, int x, int z, int w, int h)
{
    int *otyp;
    int64_t i, j;
    l->p2->getMap(l->p2, out, x, z, w, h);

    otyp = (int *) malloc(w*h*sizeof(int));
    memcpy(otyp, out, w*h*sizeof(int));

    l->p->getMap(l->p, out, x, z, w, h);


    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int landID, oceanID;

            landID = out[j*w + i];

            if (!isOceanic(landID))
                continue;

            oceanID = otyp[j*w + i];

            if (landID == deep_ocean)
            {
                switch (oceanID)
                {
                case lukewarm_ocean:
                    oceanID = deep_lukewarm_ocean;
                    break;
                case ocean:
                    oceanID = deep_ocean;
                    break;
                case cold_ocean:
                    oceanID = deep_cold_ocean;
                    break;
                case frozen_ocean:
                    oceanID = deep_frozen_ocean;
                    break;
                }
            }

            out[j*w + i] = oceanID;
        }
    }

    free(otyp);

    return 0;
}